

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pillar.cpp
# Opt level: O3

void __thiscall DPillar::Serialize(DPillar *this,FArchive *arc)

{
  FArchive *pFVar1;
  BYTE val;
  undefined1 local_19;
  
  DMover::Serialize(&this->super_DMover,arc);
  local_19 = (undefined1)this->m_Type;
  FArchive::operator<<(arc,&local_19);
  this->m_Type = (uint)(byte)local_19;
  pFVar1 = FArchive::operator<<(arc,&this->m_FloorSpeed);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_CeilingSpeed);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_FloorTarget);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_CeilingTarget);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->m_Crush);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_Hexencrush);
  pFVar1 = FArchive::SerializeObject
                     (pFVar1,(DObject **)&this->m_Interp_Floor,
                      DInterpolation::RegistrationInfo.MyClass);
  FArchive::SerializeObject
            (pFVar1,(DObject **)&this->m_Interp_Ceiling,DInterpolation::RegistrationInfo.MyClass);
  return;
}

Assistant:

void DPillar::Serialize (FArchive &arc)
{
	Super::Serialize (arc);
	arc << m_Type
		<< m_FloorSpeed
		<< m_CeilingSpeed
		<< m_FloorTarget
		<< m_CeilingTarget
		<< m_Crush
		<< m_Hexencrush
		<< m_Interp_Floor
		<< m_Interp_Ceiling;
}